

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMutex.h
# Opt level: O0

void __thiscall liblogger::LogMutex::LogMutex(LogMutex *this)

{
  int iVar1;
  pthread_mutex_t *in_RDI;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_c [3];
  
  iVar1 = pthread_mutexattr_init(local_c);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = pthread_mutexattr_settype(local_c,1);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = pthread_mutex_init(in_RDI,local_c);
  if (iVar1 != 0) {
    abort();
  }
  iVar1 = pthread_mutexattr_destroy(local_c);
  if (iVar1 != 0) {
    abort();
  }
  return;
}

Assistant:

LogMutex() {
				pthread_mutexattr_t attr;
				if (pthread_mutexattr_init(&attr) != 0)
					abort();

				if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE) != 0)
					abort();

				if (pthread_mutex_init(&m_mutex, &attr) != 0)
					abort();

				if (pthread_mutexattr_destroy(&attr) != 0)
					abort();
			}